

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void FCanvasTextureInfo::UpdateAll(void)

{
  FCanvasTexture *pFVar1;
  FRenderer *pFVar2;
  bool bVar3;
  AActor *pAVar4;
  FCanvasTextureInfo *local_10;
  FCanvasTextureInfo *probe;
  
  for (local_10 = List; local_10 != (FCanvasTextureInfo *)0x0; local_10 = local_10->Next) {
    bVar3 = TObjPtr<AActor>::operator!=(&local_10->Viewpoint,(AActor *)0x0);
    pFVar2 = Renderer;
    if ((bVar3) && ((local_10->Texture->bNeedsUpdate & 1U) != 0)) {
      pFVar1 = local_10->Texture;
      pAVar4 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_10->Viewpoint);
      (*pFVar2->_vptr_FRenderer[0x13])(pFVar2,pFVar1,pAVar4,(ulong)(uint)local_10->FOV);
    }
  }
  return;
}

Assistant:

void FCanvasTextureInfo::UpdateAll ()
{
	FCanvasTextureInfo *probe;

	for (probe = List; probe != NULL; probe = probe->Next)
	{
		if (probe->Viewpoint != NULL && probe->Texture->bNeedsUpdate)
		{
			Renderer->RenderTextureView(probe->Texture, probe->Viewpoint, probe->FOV);
		}
	}
}